

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_xor(__mpz_struct *r,__mpz_struct *u,__mpz_struct *v)

{
  mp_limb_t *pmVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mp_size_t mVar8;
  bool bVar9;
  bool bVar10;
  int local_c0;
  mp_srcptr local_b8;
  int local_b0;
  int local_ac;
  mp_size_t __mp_size_t_swap__tmp;
  mpz_srcptr __mpz_srcptr_swap__tmp;
  mp_limb_t rl;
  mp_limb_t vl;
  mp_limb_t ul;
  mp_limb_t rc;
  mp_limb_t vc;
  mp_limb_t uc;
  mp_limb_t rx;
  mp_limb_t vx;
  mp_limb_t ux;
  mp_ptr rp;
  mp_ptr vp;
  mp_ptr up;
  mp_size_t i;
  mp_size_t vn;
  mp_size_t un;
  __mpz_struct *v_local;
  __mpz_struct *u_local;
  __mpz_struct *r_local;
  
  if (u->_mp_size < 0) {
    local_ac = -u->_mp_size;
  }
  else {
    local_ac = u->_mp_size;
  }
  vn = (mp_size_t)local_ac;
  if (v->_mp_size < 0) {
    local_b0 = -v->_mp_size;
  }
  else {
    local_b0 = v->_mp_size;
  }
  lVar4 = (long)local_b0;
  i = lVar4;
  un = (mp_size_t)v;
  v_local = u;
  if (vn < lVar4) {
    i = vn;
    vn = lVar4;
    un = (mp_size_t)u;
    v_local = v;
  }
  if (i == 0) {
    mpz_set(r,v_local);
  }
  else {
    bVar9 = v_local->_mp_size < 0;
    vc = (mp_limb_t)(int)(uint)bVar9;
    bVar10 = *(int *)(un + 4) < 0;
    rc = (mp_limb_t)(int)(uint)bVar10;
    ul = (mp_limb_t)(int)(uint)(bVar9 != bVar10);
    uVar2 = -vc;
    uVar7 = -rc;
    uVar3 = -ul;
    if ((long)r->_mp_alloc < (long)(vn + ul)) {
      local_b8 = mpz_realloc(r,vn + ul);
    }
    else {
      local_b8 = r->_mp_d;
    }
    pmVar1 = v_local->_mp_d;
    lVar4 = *(long *)(un + 8);
    up = (mp_ptr)0x0;
    do {
      uVar5 = (pmVar1[(long)up] ^ uVar2) + vc;
      vc = (mp_limb_t)(int)(uint)(uVar5 < vc);
      uVar6 = (*(ulong *)(lVar4 + (long)up * 8) ^ uVar7) + rc;
      rc = (mp_limb_t)(int)(uint)(uVar6 < rc);
      uVar5 = (uVar5 ^ uVar6 ^ uVar3) + ul;
      ul = (mp_limb_t)(int)(uint)(uVar5 < ul);
      local_b8[(long)up] = uVar5;
      up = (mp_ptr)((long)up + 1);
    } while ((long)up < i);
    if (rc != 0) {
      __assert_fail("vc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                    ,0xef1,
                    "void mpz_xor(__mpz_struct *, const __mpz_struct *, const __mpz_struct *)");
    }
    for (; (long)up < vn; up = (mp_ptr)((long)up + 1)) {
      uVar7 = (pmVar1[(long)up] ^ uVar2) + vc;
      vc = (mp_limb_t)(int)(uint)(uVar7 < vc);
      uVar7 = (uVar7 ^ uVar2) + ul;
      ul = (mp_limb_t)(int)(uint)(uVar7 < ul);
      local_b8[(long)up] = uVar7;
    }
    if (ul == 0) {
      mVar8 = mpn_normalized_size(local_b8,vn);
      vn._0_4_ = (int)mVar8;
    }
    else {
      local_b8[vn] = ul;
      vn._0_4_ = (int)vn + 1;
    }
    if (uVar3 == 0) {
      local_c0 = (int)vn;
    }
    else {
      local_c0 = -(int)vn;
    }
    r->_mp_size = local_c0;
  }
  return;
}

Assistant:

void
mpz_xor (mpz_t r, const mpz_t u, const mpz_t v)
{
  mp_size_t un, vn, i;
  mp_ptr up, vp, rp;

  mp_limb_t ux, vx, rx;
  mp_limb_t uc, vc, rc;
  mp_limb_t ul, vl, rl;

  un = GMP_ABS (u->_mp_size);
  vn = GMP_ABS (v->_mp_size);
  if (un < vn)
    {
      MPZ_SRCPTR_SWAP (u, v);
      MP_SIZE_T_SWAP (un, vn);
    }
  if (vn == 0)
    {
      mpz_set (r, u);
      return;
    }

  uc = u->_mp_size < 0;
  vc = v->_mp_size < 0;
  rc = uc ^ vc;

  ux = -uc;
  vx = -vc;
  rx = -rc;

  rp = MPZ_REALLOC (r, un + (mp_size_t) rc);

  up = u->_mp_d;
  vp = v->_mp_d;

  i = 0;
  do
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      vl = (vp[i] ^ vx) + vc;
      vc = vl < vc;

      rl = (ul ^ vl ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  while (++i < vn);
  assert (vc == 0);

  for (; i < un; i++)
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      rl = (ul ^ ux) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  if (rc)
    rp[un++] = rc;
  else
    un = mpn_normalized_size (rp, un);

  r->_mp_size = rx ? -un : un;
}